

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall cmFindProgramHelper::CheckDirectory(cmFindProgramHelper *this,string *path)

{
  bool bVar1;
  anon_class_16_2_3fe44de0_for__M_pred __pred;
  
  __pred.path = path;
  __pred.this = this;
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmFindProgramHelper::CheckDirectory(std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>
                    ((this->Names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->Names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__pred);
  return bVar1;
}

Assistant:

bool CheckDirectory(std::string const& path)
  {
    return std::any_of(this->Names.begin(), this->Names.end(),
                       [this, &path](std::string const& n) -> bool {
                         // Only perform search relative to current directory
                         // if the file name contains a directory separator.
                         return this->CheckDirectoryForName(path, n);
                       });
  }